

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  ID *__k;
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  SPIRType *type;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  SPIREntryPoint *pSVar5;
  iterator iVar6;
  SPIRType *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint uVar8;
  uint uVar9;
  TypedID<(spirv_cross::Types)0> *in_R9;
  ulong uVar10;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  long lVar11;
  SPIRVariable *var_00;
  string sStack_228;
  SPIRVariable *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  char *block_qualifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  TypedID<(spirv_cross::Types)1> *local_1a0;
  char *qual;
  SPIRType newtype;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if ((((var->storage == StorageClassInput) && (type->basetype == Double)) &&
      ((this->options).es == false)) && ((this->options).version < 0x19a)) {
    ::std::__cxx11::string::string
              ((string *)&newtype,"GL_ARB_vertex_attrib_64bit",(allocator *)&sStack_228);
    require_extension_internal(this,(string *)&newtype);
    ::std::__cxx11::string::~string((string *)&newtype);
  }
  __k = &(type->super_IVariant).self;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,__k);
  uVar1 = (pmVar4->decoration).decoration_flags.lower;
  iVar3 = (*(this->super_Compiler)._vptr_Compiler[0x34])(this,var);
  qual = (char *)CONCAT44(extraout_var,iVar3);
  if ((uVar1 & 4) == 0) {
    if (type->basetype != Struct) {
LAB_0012470c:
      add_resource_name(this,(var->super_IVariant).self.id);
      SPIRType::SPIRType(&newtype,type);
      bVar2 = is_legacy(this);
      if (((bVar2) && (var->storage == StorageClassInput)) && (type->basetype == Int)) {
        newtype.basetype = Float;
      }
      if ((((type->storage == StorageClassInput) &&
           ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) &&
          (bVar2 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationPatch), !bVar2)) &&
         ((pSVar5 = Compiler::get_entry_point(&this->super_Compiler),
          pSVar5->model == ExecutionModelTessellationControl ||
          (pSVar5 = Compiler::get_entry_point(&this->super_Compiler),
          pSVar5->model == ExecutionModelTessellationEvaluation)))) {
        newtype.array.super_VectorView<unsigned_int>.ptr
        [newtype.array.super_VectorView<unsigned_int>.buffer_size - 1] = 0;
        newtype.array_size_literal.super_VectorView<bool>.ptr
        [newtype.array_size_literal.super_VectorView<bool>.buffer_size - 1] = true;
      }
      layout_for_variable_abi_cxx11_(&sStack_228,this,var);
      (*(this->super_Compiler)._vptr_Compiler[0x33])
                (&local_200,this,(ulong)(var->super_IVariant).self.id);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&block_qualifier,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (&local_1c0,this,&newtype,&block_qualifier,(ulong)(var->super_IVariant).self.id);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,&sStack_228,&local_200,&local_1c0,(char (*) [2])0x297c5b);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&block_qualifier);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::__cxx11::string::~string((string *)&sStack_228);
      SPIRType::~SPIRType(&newtype);
      return;
    }
    if ((this->options).force_flattened_io_blocks == false) {
      uVar8 = 0x95;
      if ((this->options).es != false) {
        uVar8 = 0x135;
      }
      if (uVar8 < (this->options).version) goto LAB_0012470c;
    }
  }
  else if ((this->options).force_flattened_io_blocks == false) {
    bVar2 = (this->options).es;
    uVar8 = (this->options).version;
    uVar9 = 0x95;
    if (bVar2 != false) {
      uVar9 = 0x135;
    }
    if (uVar9 < uVar8) {
      if (uVar8 < 0x140 && bVar2 == true) {
        ::std::__cxx11::string::string
                  ((string *)&newtype,"GL_EXT_geometry_shader",(allocator *)&local_200);
        bVar2 = has_extension(this,(string *)&newtype);
        if (!bVar2) {
          ::std::__cxx11::string::string
                    ((string *)&sStack_228,"GL_EXT_tessellation_shader",(allocator *)&local_1c0);
          bVar2 = has_extension(this,&sStack_228);
          ::std::__cxx11::string::~string((string *)&sStack_228);
          ::std::__cxx11::string::~string((string *)&newtype);
          if (bVar2) goto LAB_0012494b;
          ::std::__cxx11::string::string
                    ((string *)&newtype,"GL_EXT_shader_io_blocks",(allocator *)&sStack_228);
          require_extension_internal(this,(string *)&newtype);
        }
        ::std::__cxx11::string::~string((string *)&newtype);
      }
LAB_0012494b:
      local_208 = var;
      fixup_io_block_patch_primitive_qualifiers(this,var);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&newtype,this,(ulong)(type->super_IVariant).self.id,0);
      this_00 = &(this->block_output_names)._M_h;
      if (type->storage == StorageClassInput) {
        this_00 = &(this->block_input_names)._M_h;
      }
      if ((newtype.super_IVariant._8_8_ == 0) ||
         (iVar6 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(this_00,(key_type *)&newtype),
         iVar6.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        (*(this->super_Compiler)._vptr_Compiler[3])(&sStack_228,this,(ulong)__k->id);
        ::std::__cxx11::string::_M_assign((string *)&newtype);
        var_00 = local_208;
        ::std::__cxx11::string::~string((string *)&sStack_228);
      }
      else {
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)this_00,(value_type *)&newtype);
        var_00 = local_208;
      }
      if (newtype.super_IVariant._8_8_ == 0) {
        pSVar7 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,*(uint32_t *)&(var_00->super_IVariant).field_0xc);
        join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                  (&sStack_228,(spirv_cross *)0x282e15,(char (*) [2])&(pSVar7->super_IVariant).self,
                   (TypedID<(spirv_cross::Types)0> *)0x282e15,
                   (char (*) [2])&(var_00->super_IVariant).self,in_R9);
        ::std::__cxx11::string::operator=((string *)&newtype,(string *)&sStack_228);
        ::std::__cxx11::string::~string((string *)&sStack_228);
      }
      ::std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->resource_names,(value_type *)&newtype);
      bVar2 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,DecorationPatch)
      ;
      if (bVar2) {
        block_qualifier = "patch ";
      }
      else {
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,
                           DecorationPerPrimitiveEXT);
        if (bVar2) {
          block_qualifier = "perprimitiveEXT ";
        }
        else {
          bVar2 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,
                             DecorationPerVertexKHR);
          if (bVar2) {
            block_qualifier = "pervertexEXT ";
          }
          else {
            block_qualifier = "";
          }
        }
      }
      layout_for_variable_abi_cxx11_(&sStack_228,this,var_00);
      statement<std::__cxx11::string,char_const*&,char_const*&,std::__cxx11::string&>
                (this,&sStack_228,&block_qualifier,&qual,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype);
      ::std::__cxx11::string::~string((string *)&sStack_228);
      begin_scope(this);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(type->member_name_cache)._M_h);
      local_1a0 = (type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
      uVar10 = 0;
      for (lVar11 = (type->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size << 2;
          lVar11 != 0; lVar11 = lVar11 + -4) {
        add_member_name(this,type,(uint32_t)uVar10);
        uVar8 = local_1a0[uVar10].id;
        ::std::__cxx11::string::string((string *)&sStack_228,"",(allocator *)&local_200);
        (*(this->super_Compiler)._vptr_Compiler[0x15])
                  (this,type,(ulong)uVar8,uVar10 & 0xffffffff,&sStack_228,0);
        ::std::__cxx11::string::~string((string *)&sStack_228);
        uVar10 = uVar10 + 1;
        var_00 = local_208;
      }
      add_resource_name(this,(var_00->super_IVariant).self.id);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&local_200,this,(ulong)(var_00->super_IVariant).self.id,1);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(var_00->super_IVariant).self.id;
      (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_1c0,this,type);
      join<std::__cxx11::string,std::__cxx11::string>
                (&sStack_228,(spirv_cross *)&local_200,&local_1c0,ts_1);
      end_scope_decl(this,&sStack_228);
      ::std::__cxx11::string::~string((string *)&sStack_228);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_200);
      statement<char_const(&)[1]>(this,(char (*) [1])0x272bdf);
      ::std::__cxx11::string::~string((string *)&newtype);
      return;
    }
  }
  emit_flattened_io_block(this,var,qual);
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	if (var.storage == StorageClassInput && type.basetype == SPIRType::Double &&
	    !options.es && options.version < 410)
	{
		require_extension_internal("GL_ARB_vertex_attrib_64bit");
	}

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Workaround to make sure we can emit "patch in/out" correctly.
			fixup_io_block_patch_primitive_qualifiers(var);

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			const char *block_qualifier;
			if (has_decoration(var.self, DecorationPatch))
				block_qualifier = "patch ";
			else if (has_decoration(var.self, DecorationPerPrimitiveEXT))
				block_qualifier = "perprimitiveEXT ";
			else if (has_decoration(var.self, DecorationPerVertexKHR))
				block_qualifier = "pervertexEXT ";
			else
				block_qualifier = "";

			statement(layout_for_variable(var), block_qualifier, qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type, var.self)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Legacy GLSL did not support int attributes, we automatically
			// declare them as float and cast them on load/store
			SPIRType newtype = type;
			if (is_legacy() && var.storage == StorageClassInput && type.basetype == SPIRType::Int)
				newtype.basetype = SPIRType::Float;

			// Tessellation control and evaluation shaders must have either
			// gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			if (type.storage == StorageClassInput && !type.array.empty() &&
			    !has_decoration(var.self, DecorationPatch) &&
			    (get_entry_point().model == ExecutionModelTessellationControl ||
			     get_entry_point().model == ExecutionModelTessellationEvaluation))
			{
				newtype.array.back() = 0;
				newtype.array_size_literal.back() = true;
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(newtype, to_name(var.self), var.self), ";");
		}
	}
}